

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2predicates.cc
# Opt level: O2

int s2pred::EdgeCircumcenterSign(S2Point *x0,S2Point *x1,S2Point *a,S2Point *b,S2Point *c)

{
  bool bVar1;
  int abc_sign;
  int iVar2;
  longdouble lVar3;
  Vector3_xf local_128;
  undefined1 local_f8 [16];
  longdouble local_e8;
  longdouble local_d8;
  Vector3_xf local_c8;
  Vector3_xf local_98;
  Vector3_xf local_68;
  
  local_f8._0_4_ = *(undefined4 *)x1->c_;
  local_f8._4_4_ = *(uint *)((long)x1->c_ + 4) ^ 0x80000000;
  local_f8._12_4_ = *(uint *)((long)x1->c_ + 0xc) ^ 0x80000000;
  local_f8._8_2_ = (undefined2)*(undefined4 *)(x1->c_ + 1);
  local_f8._10_2_ = (undefined2)((uint)*(undefined4 *)(x1->c_ + 1) >> 0x10);
  local_e8 = (longdouble)CONCAT28(local_e8._8_2_,-x1->c_[2]);
  bVar1 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator!=
                    ((BasicVector<Vector3,_double,_3UL> *)x0,(D *)local_f8);
  if (bVar1) {
    abc_sign = Sign(a,b,c);
    iVar2 = TriageEdgeCircumcenterSign<double>(x0,x1,a,b,c,abc_sign);
    if (iVar2 == 0) {
      bVar1 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator==
                        ((BasicVector<Vector3,_double,_3UL> *)x0,x1);
      iVar2 = 0;
      if ((((!bVar1) &&
           (bVar1 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator==
                              ((BasicVector<Vector3,_double,_3UL> *)a,b), !bVar1)) &&
          (bVar1 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator==
                             ((BasicVector<Vector3,_double,_3UL> *)b,c), iVar2 = 0, !bVar1)) &&
         (bVar1 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator==
                            ((BasicVector<Vector3,_double,_3UL> *)c,a), !bVar1)) {
        lVar3 = (longdouble)x0->c_[0];
        local_e8 = (longdouble)x0->c_[1];
        local_d8 = (longdouble)x0->c_[2];
        local_f8._0_4_ = SUB104(lVar3,0);
        local_f8._4_4_ = (undefined4)((unkuint10)lVar3 >> 0x20);
        local_f8._8_2_ = (undefined2)((unkuint10)lVar3 >> 0x40);
        local_128.c_[1]._0_10_ = (BADTYPE)x1->c_[1];
        local_128.c_[2]._0_10_ = (BADTYPE)x1->c_[2];
        local_128.c_[0]._0_8_ = SUB108((longdouble)x1->c_[0],0);
        local_128.c_[0].bn_.bn_._0_2_ = (undefined2)((unkuint10)(longdouble)x1->c_[0] >> 0x40);
        local_68.c_[0]._0_10_ = (BADTYPE)a->c_[0];
        local_68.c_[1]._0_10_ = (BADTYPE)a->c_[1];
        local_68.c_[2]._0_10_ = (BADTYPE)a->c_[2];
        local_98.c_[0]._0_10_ = (BADTYPE)b->c_[0];
        local_98.c_[1]._0_10_ = (BADTYPE)b->c_[1];
        local_98.c_[2]._0_10_ = (BADTYPE)b->c_[2];
        local_c8.c_[0]._0_10_ = (BADTYPE)c->c_[0];
        local_c8.c_[1]._0_10_ = (BADTYPE)c->c_[1];
        local_c8.c_[2]._0_10_ = (BADTYPE)c->c_[2];
        iVar2 = TriageEdgeCircumcenterSign<long_double>
                          ((Vector3<long_double> *)local_f8,(Vector3<long_double> *)&local_128,
                           (Vector3<long_double> *)&local_68,(Vector3<long_double> *)&local_98,
                           (Vector3<long_double> *)&local_c8,abc_sign);
        if (iVar2 == 0) {
          util::math::internal_vector::BasicVector<Vector3,ExactFloat,3ul>::
          GenerateEach<Vector3<ExactFloat>,0ul,1ul,2ul,util::math::internal_vector::BasicVector<Vector3,ExactFloat,3ul>::Cast<double>(Vector3<double>const&)::_lambda(double_const&)_1_,double_const>
                    (local_f8,(BasicVector<Vector3,ExactFloat,3ul> *)x0);
          util::math::internal_vector::BasicVector<Vector3,ExactFloat,3ul>::
          GenerateEach<Vector3<ExactFloat>,0ul,1ul,2ul,util::math::internal_vector::BasicVector<Vector3,ExactFloat,3ul>::Cast<double>(Vector3<double>const&)::_lambda(double_const&)_1_,double_const>
                    (&local_128,(BasicVector<Vector3,ExactFloat,3ul> *)x1);
          util::math::internal_vector::BasicVector<Vector3,ExactFloat,3ul>::
          GenerateEach<Vector3<ExactFloat>,0ul,1ul,2ul,util::math::internal_vector::BasicVector<Vector3,ExactFloat,3ul>::Cast<double>(Vector3<double>const&)::_lambda(double_const&)_1_,double_const>
                    (&local_68,(BasicVector<Vector3,ExactFloat,3ul> *)a);
          util::math::internal_vector::BasicVector<Vector3,ExactFloat,3ul>::
          GenerateEach<Vector3<ExactFloat>,0ul,1ul,2ul,util::math::internal_vector::BasicVector<Vector3,ExactFloat,3ul>::Cast<double>(Vector3<double>const&)::_lambda(double_const&)_1_,double_const>
                    (&local_98,(BasicVector<Vector3,ExactFloat,3ul> *)b);
          util::math::internal_vector::BasicVector<Vector3,ExactFloat,3ul>::
          GenerateEach<Vector3<ExactFloat>,0ul,1ul,2ul,util::math::internal_vector::BasicVector<Vector3,ExactFloat,3ul>::Cast<double>(Vector3<double>const&)::_lambda(double_const&)_1_,double_const>
                    (&local_c8,(BasicVector<Vector3,ExactFloat,3ul> *)c);
          iVar2 = ExactEdgeCircumcenterSign
                            ((Vector3_xf *)local_f8,&local_128,&local_68,&local_98,&local_c8,
                             abc_sign);
          Vector3<ExactFloat>::~Vector3(&local_c8);
          Vector3<ExactFloat>::~Vector3(&local_98);
          Vector3<ExactFloat>::~Vector3(&local_68);
          Vector3<ExactFloat>::~Vector3(&local_128);
          Vector3<ExactFloat>::~Vector3((Vector3<ExactFloat> *)local_f8);
          if (iVar2 == 0) {
            iVar2 = SymbolicEdgeCircumcenterSign(x0,x1,a,b,c);
          }
        }
      }
    }
    return iVar2;
  }
  S2LogMessage::S2LogMessage
            ((S2LogMessage *)&local_128,
             "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2predicates.cc"
             ,0x426,kFatal,(ostream *)&std::cerr);
  std::operator<<((ostream *)CONCAT62(local_128.c_[0].bn_.bn_._2_6_,local_128.c_[0].bn_.bn_._0_2_),
                  "Check failed: (x0) != (-x1) ");
  abort();
}

Assistant:

int EdgeCircumcenterSign(const S2Point& x0, const S2Point& x1,
                         const S2Point& a, const S2Point& b,
                         const S2Point& c) {
  // Check that the edge does not consist of antipodal points.  (This catches
  // the most common case -- the full test is in ExactEdgeCircumcenterSign.)
  S2_DCHECK_NE(x0, -x1);

  int abc_sign = Sign(a, b, c);
  int sign = TriageEdgeCircumcenterSign(x0, x1, a, b, c, abc_sign);
  if (sign != 0) return sign;

  // Optimization for the cases that are going to return zero anyway, in order
  // to avoid falling back to exact arithmetic.
  if (x0 == x1 || a == b || b == c || c == a) return 0;

  sign = TriageEdgeCircumcenterSign(
      ToLD(x0), ToLD(x1), ToLD(a), ToLD(b), ToLD(c), abc_sign);
  if (sign != 0) return sign;
  sign = ExactEdgeCircumcenterSign(
      ToExact(x0), ToExact(x1), ToExact(a), ToExact(b), ToExact(c), abc_sign);
  if (sign != 0) return sign;

  // Unlike the other methods, SymbolicEdgeCircumcenterSign does not depend
  // on the sign of triangle ABC.
  return SymbolicEdgeCircumcenterSign(x0, x1, a, b, c);
}